

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O3

REF_STATUS
ref_part_bin_ugrid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename,
                  REF_BOOL swap_endian,REF_BOOL sixty_four_bit)

{
  int iVar1;
  REF_GRID ref_grid;
  REF_NODE ref_node;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  size_t sVar4;
  byte bVar5;
  undefined8 uVar6;
  long lVar7;
  char *pcVar8;
  uint local_74;
  FILE *local_70;
  REF_LONG nnode;
  REF_LONG nqua;
  REF_LONG ntri;
  REF_LONG ntet;
  REF_LONG npyr;
  REF_LONG npri;
  REF_LONG nhex;
  
  iVar1 = ref_mpi->timing;
  uVar2 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar2 != 0) {
    pcVar8 = "create grid";
    uVar6 = 0x53f;
    goto LAB_0018615a;
  }
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid->node;
  if (0 < iVar1) {
    ref_mpi_stopwatch_start(ref_grid->mpi);
  }
  if (ref_grid->mpi->id == 0) {
    __stream = fopen(filename,"r");
    local_70 = __stream;
    if (__stream == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x54b,
             "ref_part_bin_ugrid","unable to open file");
      return 2;
    }
    if (sixty_four_bit == 0) {
      sVar4 = fread(&local_74,4,1,__stream);
      if (sVar4 != 1) {
        pcVar8 = "nnode";
        uVar6 = 0x560;
        goto LAB_00186947;
      }
      if (swap_endian != 0) {
        local_74 = local_74 >> 0x18 | (local_74 & 0xff0000) >> 8 | (local_74 & 0xff00) << 8 |
                   local_74 << 0x18;
      }
      nnode = (REF_LONG)(int)local_74;
      sVar4 = fread(&local_74,4,1,__stream);
      if (sVar4 != 1) {
        pcVar8 = "ntri";
        uVar6 = 0x563;
        goto LAB_00186947;
      }
      if (swap_endian != 0) {
        local_74 = local_74 >> 0x18 | (local_74 & 0xff0000) >> 8 | (local_74 & 0xff00) << 8 |
                   local_74 << 0x18;
      }
      ntri = (REF_LONG)(int)local_74;
      sVar4 = fread(&local_74,4,1,__stream);
      if (sVar4 != 1) {
        pcVar8 = "nqua";
        uVar6 = 0x566;
        goto LAB_00186947;
      }
      if (swap_endian != 0) {
        local_74 = local_74 >> 0x18 | (local_74 & 0xff0000) >> 8 | (local_74 & 0xff00) << 8 |
                   local_74 << 0x18;
      }
      nqua = (REF_LONG)(int)local_74;
      sVar4 = fread(&local_74,4,1,__stream);
      if (sVar4 != 1) {
        pcVar8 = "ntet";
        uVar6 = 0x569;
        goto LAB_00186947;
      }
      if (swap_endian != 0) {
        local_74 = local_74 >> 0x18 | (local_74 & 0xff0000) >> 8 | (local_74 & 0xff00) << 8 |
                   local_74 << 0x18;
      }
      ntet = (REF_LONG)(int)local_74;
      sVar4 = fread(&local_74,4,1,__stream);
      if (sVar4 != 1) {
        pcVar8 = "npyr";
        uVar6 = 0x56c;
        goto LAB_00186947;
      }
      if (swap_endian != 0) {
        local_74 = local_74 >> 0x18 | (local_74 & 0xff0000) >> 8 | (local_74 & 0xff00) << 8 |
                   local_74 << 0x18;
      }
      npyr = (REF_LONG)(int)local_74;
      sVar4 = fread(&local_74,4,1,__stream);
      if (sVar4 != 1) {
        pcVar8 = "npri";
        uVar6 = 0x56f;
        goto LAB_00186947;
      }
      if (swap_endian != 0) {
        local_74 = local_74 >> 0x18 | (local_74 & 0xff0000) >> 8 | (local_74 & 0xff00) << 8 |
                   local_74 << 0x18;
      }
      npri = (REF_LONG)(int)local_74;
      sVar4 = fread(&local_74,4,1,__stream);
      if (sVar4 != 1) {
        pcVar8 = "nhex";
        uVar6 = 0x572;
        goto LAB_00186947;
      }
      uVar2 = local_74;
      if (swap_endian != 0) {
        uVar2 = local_74 >> 0x18 | (local_74 & 0xff0000) >> 8 | (local_74 & 0xff00) << 8 |
                local_74 << 0x18;
      }
      nhex = (REF_LONG)(int)uVar2;
    }
    else {
      sVar4 = fread(&nnode,8,1,__stream);
      if (sVar4 != 1) {
        pcVar8 = "nnode";
        uVar6 = 0x54e;
LAB_00186947:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               uVar6,"ref_part_bin_ugrid",pcVar8);
        return 1;
      }
      sVar4 = fread(&ntri,8,1,__stream);
      if (sVar4 != 1) {
        pcVar8 = "ntri";
        uVar6 = 0x54f;
        goto LAB_00186947;
      }
      sVar4 = fread(&nqua,8,1,__stream);
      if (sVar4 != 1) {
        pcVar8 = "nqua";
        uVar6 = 0x550;
        goto LAB_00186947;
      }
      sVar4 = fread(&ntet,8,1,__stream);
      if (sVar4 != 1) {
        pcVar8 = "ntet";
        uVar6 = 0x551;
        goto LAB_00186947;
      }
      sVar4 = fread(&npyr,8,1,__stream);
      if (sVar4 != 1) {
        pcVar8 = "npyr";
        uVar6 = 0x552;
        goto LAB_00186947;
      }
      sVar4 = fread(&npri,8,1,__stream);
      if (sVar4 != 1) {
        pcVar8 = "npri";
        uVar6 = 0x553;
        goto LAB_00186947;
      }
      sVar4 = fread(&nhex,8,1,__stream);
      if (sVar4 != 1) {
        pcVar8 = "nhex";
        uVar6 = 0x554;
        goto LAB_00186947;
      }
      if (swap_endian != 0) {
        nnode = (ulong)nnode >> 0x38 | (nnode & 0xff000000000000U) >> 0x28 |
                (nnode & 0xff0000000000U) >> 0x18 | (nnode & 0xff00000000U) >> 8 |
                (nnode & 0xff000000U) << 8 | (nnode & 0xff0000U) << 0x18 | (nnode & 0xff00U) << 0x28
                | nnode << 0x38;
        ntri = (ulong)ntri >> 0x38 | (ntri & 0xff000000000000U) >> 0x28 |
               (ntri & 0xff0000000000U) >> 0x18 | (ntri & 0xff00000000U) >> 8 |
               (ntri & 0xff000000U) << 8 | (ntri & 0xff0000U) << 0x18 | (ntri & 0xff00U) << 0x28 |
               ntri << 0x38;
        nqua = (ulong)nqua >> 0x38 | (nqua & 0xff000000000000U) >> 0x28 |
               (nqua & 0xff0000000000U) >> 0x18 | (nqua & 0xff00000000U) >> 8 |
               (nqua & 0xff000000U) << 8 | (nqua & 0xff0000U) << 0x18 | (nqua & 0xff00U) << 0x28 |
               nqua << 0x38;
        ntet = (ulong)ntet >> 0x38 | (ntet & 0xff000000000000U) >> 0x28 |
               (ntet & 0xff0000000000U) >> 0x18 | (ntet & 0xff00000000U) >> 8 |
               (ntet & 0xff000000U) << 8 | (ntet & 0xff0000U) << 0x18 | (ntet & 0xff00U) << 0x28 |
               ntet << 0x38;
        npyr = (ulong)npyr >> 0x38 | (npyr & 0xff000000000000U) >> 0x28 |
               (npyr & 0xff0000000000U) >> 0x18 | (npyr & 0xff00000000U) >> 8 |
               (npyr & 0xff000000U) << 8 | (npyr & 0xff0000U) << 0x18 | (npyr & 0xff00U) << 0x28 |
               npyr << 0x38;
        npri = (ulong)npri >> 0x38 | (npri & 0xff000000000000U) >> 0x28 |
               (npri & 0xff0000000000U) >> 0x18 | (npri & 0xff00000000U) >> 8 |
               (npri & 0xff000000U) << 8 | (npri & 0xff0000U) << 0x18 | (npri & 0xff00U) << 0x28 |
               npri << 0x38;
        nhex = (ulong)nhex >> 0x38 | (nhex & 0xff000000000000U) >> 0x28 |
               (nhex & 0xff0000000000U) >> 0x18 | (nhex & 0xff00000000U) >> 8 |
               (nhex & 0xff000000U) << 8 | (nhex & 0xff0000U) << 0x18 | (nhex & 0xff00U) << 0x28 |
               nhex << 0x38;
      }
    }
  }
  else {
    local_70 = (FILE *)0x0;
  }
  uVar2 = ref_mpi_bcast(ref_grid->mpi,&nnode,1,2);
  if (uVar2 != 0) {
    pcVar8 = "bcast";
    uVar6 = 0x578;
    goto LAB_0018615a;
  }
  uVar2 = ref_mpi_bcast(ref_grid->mpi,&ntri,1,2);
  if (uVar2 != 0) {
    pcVar8 = "bcast";
    uVar6 = 0x579;
    goto LAB_0018615a;
  }
  uVar2 = ref_mpi_bcast(ref_grid->mpi,&nqua,1,2);
  if (uVar2 != 0) {
    pcVar8 = "bcast";
    uVar6 = 0x57a;
    goto LAB_0018615a;
  }
  uVar2 = ref_mpi_bcast(ref_grid->mpi,&ntet,1,2);
  if (uVar2 != 0) {
    pcVar8 = "bcast";
    uVar6 = 0x57b;
    goto LAB_0018615a;
  }
  uVar2 = ref_mpi_bcast(ref_grid->mpi,&npyr,1,2);
  if (uVar2 != 0) {
    pcVar8 = "bcast";
    uVar6 = 0x57c;
    goto LAB_0018615a;
  }
  uVar2 = ref_mpi_bcast(ref_grid->mpi,&npri,1,2);
  if (uVar2 != 0) {
    pcVar8 = "bcast";
    uVar6 = 0x57d;
    goto LAB_0018615a;
  }
  uVar2 = ref_mpi_bcast(ref_grid->mpi,&nhex,1,2);
  if (uVar2 != 0) {
    pcVar8 = "bcast";
    uVar6 = 0x57e;
    goto LAB_0018615a;
  }
  if (iVar1 < 1) {
    uVar2 = ref_part_node((FILE *)local_70,swap_endian,0,0,ref_node,nnode);
    if (uVar2 != 0) goto LAB_00186985;
  }
  else {
    ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid header");
    uVar2 = ref_part_node((FILE *)local_70,swap_endian,0,0,ref_node,nnode);
    if (uVar2 != 0) {
LAB_00186985:
      pcVar8 = "part node";
      uVar6 = 0x584;
      goto LAB_0018615a;
    }
    ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid nodes");
  }
  if (0 < ntri) {
    lVar7 = nnode * 0x18 + 0x38;
    if (sixty_four_bit == 0) {
      lVar7 = nnode * 0x18 + 0x1c;
    }
    bVar5 = sixty_four_bit == 0 ^ 3;
    uVar2 = ref_part_bin_ugrid_cell
                      (ref_grid->cell[3],ntri,ref_node,nnode,(FILE *)local_70,lVar7,
                       ((nqua << 2) << bVar5) + (ntri * 3 << bVar5) + lVar7,swap_endian,
                       sixty_four_bit);
    if (uVar2 != 0) {
      pcVar8 = "tri";
      uVar6 = 0x58f;
      goto LAB_0018615a;
    }
  }
  if (0 < nqua) {
    lVar7 = nnode * 0x18 + 0x38;
    if (sixty_four_bit == 0) {
      lVar7 = nnode * 0x18 + 0x1c;
    }
    bVar5 = sixty_four_bit == 0 ^ 3;
    uVar2 = ref_part_bin_ugrid_cell
                      (ref_grid->cell[6],nqua,ref_node,nnode,(FILE *)local_70,
                       (ntri * 3 << bVar5) + lVar7,
                       (nqua * 4 << bVar5) + lVar7 + ((ntri << 2) << bVar5),swap_endian,
                       sixty_four_bit);
    if (uVar2 != 0) {
      pcVar8 = "qua";
      uVar6 = 0x59b;
      goto LAB_0018615a;
    }
  }
  if (0 < iVar1) {
    ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid bound");
  }
  if (0 < ntet) {
    lVar7 = nnode * 0x18 + 0x38;
    if (sixty_four_bit == 0) {
      lVar7 = nnode * 0x18 + 0x1c;
    }
    bVar5 = sixty_four_bit == 0 ^ 3;
    uVar2 = ref_part_bin_ugrid_cell
                      (ref_grid->cell[8],ntet,ref_node,nnode,(FILE *)local_70,
                       (nqua * 5 << bVar5) + ((ntri << 2) << bVar5) + lVar7,-1,swap_endian,
                       sixty_four_bit);
    if (uVar2 != 0) {
      pcVar8 = "tet";
      uVar6 = 0x5a7;
      goto LAB_0018615a;
    }
  }
  if (0 < iVar1) {
    ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid tet");
  }
  if (0 < npyr) {
    lVar7 = nnode * 0x18 + 0x38;
    if (sixty_four_bit == 0) {
      lVar7 = nnode * 0x18 + 0x1c;
    }
    bVar5 = sixty_four_bit == 0 ^ 3;
    uVar2 = ref_part_bin_ugrid_cell
                      (ref_grid->cell[9],npyr,ref_node,nnode,(FILE *)local_70,
                       ((ntet << 2) << bVar5) + (nqua * 5 << bVar5) + ((ntri << 2) << bVar5) + lVar7
                       ,-1,swap_endian,sixty_four_bit);
    if (uVar2 != 0) {
      pcVar8 = "pyr";
      uVar6 = 0x5b3;
      goto LAB_0018615a;
    }
  }
  if (0 < iVar1) {
    ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid pyr");
  }
  if (0 < npri) {
    lVar7 = nnode * 0x18 + 0x38;
    if (sixty_four_bit == 0) {
      lVar7 = nnode * 0x18 + 0x1c;
    }
    bVar5 = sixty_four_bit == 0 ^ 3;
    uVar2 = ref_part_bin_ugrid_cell
                      (ref_grid->cell[10],npri,ref_node,nnode,(FILE *)local_70,
                       (npyr * 5 << bVar5) +
                       ((ntet << 2) << bVar5) + (nqua * 5 << bVar5) + ((ntri << 2) << bVar5) + lVar7
                       ,-1,swap_endian,sixty_four_bit);
    if (uVar2 != 0) {
      pcVar8 = "pri";
      uVar6 = 0x5c0;
      goto LAB_0018615a;
    }
  }
  if (0 < iVar1) {
    ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid pri");
  }
  if (0 < nhex) {
    lVar7 = nnode * 0x18 + 0x38;
    if (sixty_four_bit == 0) {
      lVar7 = nnode * 0x18 + 0x1c;
    }
    bVar5 = sixty_four_bit == 0 ^ 3;
    uVar2 = ref_part_bin_ugrid_cell
                      (ref_grid->cell[0xb],nhex,ref_node,nnode,(FILE *)local_70,
                       (npri * 6 << bVar5) + (npyr * 5 << bVar5) +
                       ((ntet << 2) << bVar5) + (nqua * 5 << bVar5) + ((ntri << 2) << bVar5) + lVar7
                       ,-1,swap_endian,sixty_four_bit);
    if (uVar2 != 0) {
      pcVar8 = "hex";
      uVar6 = 0x5ce;
      goto LAB_0018615a;
    }
  }
  if (0 < iVar1) {
    ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid hex");
  }
  if ((ref_grid->mpi->id == 0) && (iVar3 = fclose(local_70), iVar3 != 0)) {
    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x5d2,
           "ref_part_bin_ugrid","close file",0,(long)iVar3);
    return 1;
  }
  uVar2 = ref_node_ghost_real(ref_node);
  if (uVar2 == 0) {
    if (iVar1 < 1) {
      uVar2 = ref_grid_inward_boundary_orientation(ref_grid);
      if (uVar2 == 0) {
        return 0;
      }
    }
    else {
      ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid ghost");
      uVar2 = ref_grid_inward_boundary_orientation(ref_grid);
      if (uVar2 == 0) {
        ref_mpi_stopwatch_stop(ref_grid->mpi,"ugrid volume");
        return 0;
      }
    }
    pcVar8 = "inward boundary orientation";
    uVar6 = 0x5da;
  }
  else {
    pcVar8 = "ghost real";
    uVar6 = 0x5d6;
  }
LAB_0018615a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar6,
         "ref_part_bin_ugrid",(ulong)uVar2,pcVar8);
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_part_bin_ugrid(REF_GRID *ref_grid_ptr,
                                             REF_MPI ref_mpi,
                                             const char *filename,
                                             REF_BOOL swap_endian,
                                             REF_BOOL sixty_four_bit) {
  FILE *file;
  REF_LONG nnode, ntri, nqua, ntet, npyr, npri, nhex;

  REF_FILEPOS conn_offset, faceid_offset;

  REF_GRID ref_grid;
  REF_NODE ref_node;

  REF_INT version = 0;
  REF_BOOL instrument = (ref_mpi_timing(ref_mpi) > 0);

  REF_INT single;
  REF_FILEPOS ibyte;
  ibyte = (sixty_four_bit ? 8 : 4);

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  if (instrument) ref_mpi_stopwatch_start(ref_grid_mpi(ref_grid));

  /* header */

  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "r");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");

    if (sixty_four_bit) {
      RES(1, fread(&nnode, sizeof(REF_LONG), 1, file), "nnode");
      RES(1, fread(&ntri, sizeof(REF_LONG), 1, file), "ntri");
      RES(1, fread(&nqua, sizeof(REF_LONG), 1, file), "nqua");
      RES(1, fread(&ntet, sizeof(REF_LONG), 1, file), "ntet");
      RES(1, fread(&npyr, sizeof(REF_LONG), 1, file), "npyr");
      RES(1, fread(&npri, sizeof(REF_LONG), 1, file), "npri");
      RES(1, fread(&nhex, sizeof(REF_LONG), 1, file), "nhex");

      if (swap_endian) {
        SWAP_LONG(nnode);
        SWAP_LONG(ntri);
        SWAP_LONG(nqua);
        SWAP_LONG(ntet);
        SWAP_LONG(npyr);
        SWAP_LONG(npri);
        SWAP_LONG(nhex);
      }
    } else {
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "nnode");
      if (swap_endian) SWAP_INT(single);
      nnode = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "ntri");
      if (swap_endian) SWAP_INT(single);
      ntri = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "nqua");
      if (swap_endian) SWAP_INT(single);
      nqua = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "ntet");
      if (swap_endian) SWAP_INT(single);
      ntet = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "npyr");
      if (swap_endian) SWAP_INT(single);
      npyr = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "npri");
      if (swap_endian) SWAP_INT(single);
      npri = single;
      RES(1, fread(&single, sizeof(REF_INT), 1, file), "nhex");
      if (swap_endian) SWAP_INT(single);
      nhex = single;
    }
  }

  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &nnode, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &ntri, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &nqua, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &ntet, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &npyr, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &npri, 1, REF_LONG_TYPE), "bcast");
  RSS(ref_mpi_bcast(ref_grid_mpi(ref_grid), &nhex, 1, REF_LONG_TYPE), "bcast");

  if (instrument)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid header");

  RSS(ref_part_node(file, swap_endian, version, REF_FALSE, ref_node, nnode),
      "part node");
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid nodes");

  if (0 < ntri) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3);
    faceid_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                    (REF_FILEPOS)ntri * 3 * ibyte +
                    (REF_FILEPOS)nqua * 4 * ibyte;
    RSS(ref_part_bin_ugrid_cell(ref_grid_tri(ref_grid), ntri, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "tri");
  }

  if (0 < nqua) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 3 * ibyte;
    faceid_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                    (REF_FILEPOS)ntri * 4 * ibyte +
                    (REF_FILEPOS)nqua * 4 * ibyte;
    RSS(ref_part_bin_ugrid_cell(ref_grid_qua(ref_grid), nqua, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "qua");
  }

  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid bound");

  if (0 < ntet) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 4 * ibyte + (REF_FILEPOS)nqua * 5 * ibyte;
    faceid_offset = (REF_FILEPOS)REF_EMPTY;
    RSS(ref_part_bin_ugrid_cell(ref_grid_tet(ref_grid), ntet, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "tet");
  }
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid tet");

  if (0 < npyr) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 4 * ibyte +
                  (REF_FILEPOS)nqua * 5 * ibyte + (REF_FILEPOS)ntet * 4 * ibyte;
    faceid_offset = (REF_FILEPOS)REF_EMPTY;
    RSS(ref_part_bin_ugrid_cell(ref_grid_pyr(ref_grid), npyr, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "pyr");
  }
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid pyr");

  if (0 < npri) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 4 * ibyte +
                  (REF_FILEPOS)nqua * 5 * ibyte +
                  (REF_FILEPOS)ntet * 4 * ibyte + (REF_FILEPOS)npyr * 5 * ibyte;
    faceid_offset = (REF_FILEPOS)REF_EMPTY;
    RSS(ref_part_bin_ugrid_cell(ref_grid_pri(ref_grid), npri, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "pri");
  }
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid pri");

  if (0 < nhex) {
    conn_offset = 7 * ibyte + (REF_FILEPOS)nnode * (8 * 3) +
                  (REF_FILEPOS)ntri * 4 * ibyte +
                  (REF_FILEPOS)nqua * 5 * ibyte +
                  (REF_FILEPOS)ntet * 4 * ibyte +
                  (REF_FILEPOS)npyr * 5 * ibyte + (REF_FILEPOS)npri * 6 * ibyte;
    faceid_offset = REF_EMPTY;
    RSS(ref_part_bin_ugrid_cell(ref_grid_hex(ref_grid), nhex, ref_node, nnode,
                                file, conn_offset, faceid_offset, swap_endian,
                                sixty_four_bit),
        "hex");
  }
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid hex");

  if (ref_grid_once(ref_grid)) REIS(0, fclose(file), "close file");

  /* ghost xyz */

  RSS(ref_node_ghost_real(ref_node), "ghost real");
  if (instrument) ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid ghost");

  RSS(ref_grid_inward_boundary_orientation(ref_grid),
      "inward boundary orientation");

  if (instrument)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "ugrid volume");

  return REF_SUCCESS;
}